

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.hpp
# Opt level: O3

pair<std::shared_ptr<unsigned_char>,_pstore::typed_address<unsigned_char>_> * __thiscall
pstore::transaction_base::alloc_rw<unsigned_char,void>
          (pair<std::shared_ptr<unsigned_char>,_pstore::typed_address<unsigned_char>_>
           *__return_storage_ptr__,transaction_base *this,size_t num)

{
  pair<std::shared_ptr<void>,_pstore::address> result;
  pair<std::shared_ptr<void>,_pstore::address> local_28;
  
  alloc_rw(&local_28,this,num,1);
  if (local_28.first.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (__return_storage_ptr__->first).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)
             local_28.first.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (__return_storage_ptr__->first).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->second).a_.a_ = local_28.second.a_;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28.first.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_28.first.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
      (__return_storage_ptr__->first).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)
               local_28.first.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (__return_storage_ptr__->first).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           local_28.first.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (__return_storage_ptr__->second).a_.a_ = local_28.second.a_;
      if (local_28.first.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return __return_storage_ptr__;
      }
    }
    else {
      (local_28.first.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_28.first.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      (__return_storage_ptr__->first).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)
               local_28.first.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (__return_storage_ptr__->first).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           local_28.first.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (__return_storage_ptr__->second).a_.a_ = local_28.second.a_;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.first.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  return __return_storage_ptr__;
}

Assistant:

auto alloc_rw (std::size_t const num = 1)
            -> std::pair<std::shared_ptr<Ty>, typed_address<Ty>> {
            auto result = this->alloc_rw (sizeof (Ty) * num, alignof (Ty));
            return {std::static_pointer_cast<Ty> (result.first), typed_address<Ty> (result.second)};
        }